

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm.hpp
# Opt level: O2

void __thiscall baryonyx::pnm_array::pnm_array(pnm_array *this,uint m,uint n)

{
  pointer __p_00;
  ulong __n;
  pointer __p;
  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> local_20;
  
  (this->m_buffer)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  this->m_width = n;
  this->m_heigth = m;
  if (n * m != 0) {
    __n = (ulong)(n * m * 3);
    __p_00 = (pointer)operator_new__(__n);
    memset(__p_00,0,__n);
    local_20._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
         (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)0x0;
    std::__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>::reset
              ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)this,__p_00)
    ;
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_20);
  }
  return;
}

Assistant:

pnm_array(unsigned int m, unsigned int n)
      : m_width(n)
      , m_heigth(m)
    {
        if (m_width * m_heigth > 0)
            m_buffer = std::make_unique<std::uint8_t[]>(size());
    }